

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O0

int read_attribute_sub(coda_cdf_product *product_file,int64_t offset,int32_t byte_size,
                      coda_type *definition,coda_dynamic_type **attribute)

{
  int iVar1;
  coda_mem_data *pcVar2;
  uint8_t local_50;
  undefined1 uStack_4f;
  undefined2 uStack_4e;
  undefined4 uStack_4c;
  anon_union_8_9_56e8ce14 buffer_1;
  char *pcStack_40;
  coda_endianness other_endianness;
  char *buffer;
  coda_dynamic_type **attribute_local;
  coda_type *definition_local;
  int64_t iStack_20;
  int32_t byte_size_local;
  int64_t offset_local;
  coda_cdf_product *product_file_local;
  
  buffer = (char *)attribute;
  attribute_local = (coda_dynamic_type **)definition;
  definition_local._4_4_ = byte_size;
  iStack_20 = offset;
  offset_local = (int64_t)product_file;
  if (definition->type_class == coda_text_class) {
    pcStack_40 = (char *)malloc((long)(byte_size + 1));
    if (pcStack_40 == (char *)0x0) {
      coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                     (long)definition_local._4_4_ + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                     ,0x4c);
      return -1;
    }
    iVar1 = read_bytes(*(coda_product **)(offset_local + 0x48),iStack_20,
                       (long)definition_local._4_4_,pcStack_40);
    if (iVar1 != 0) {
      free(pcStack_40);
      return -1;
    }
    pcStack_40[definition_local._4_4_] = '\0';
    pcVar2 = coda_mem_string_new((coda_type_text *)attribute_local,(coda_dynamic_type *)0x0,
                                 (coda_product *)offset_local,pcStack_40);
    *(coda_mem_data **)buffer = pcVar2;
    free(pcStack_40);
  }
  else {
    buffer_1.as_int32[1] = 0;
    iVar1 = read_bytes(product_file->raw_product,offset,(long)byte_size,&local_50);
    if (iVar1 != 0) {
      return -1;
    }
    if (*(int *)(offset_local + 0x5c) == buffer_1.as_int32[1]) {
      switch(definition_local._4_4_) {
      case 1:
        break;
      case 2:
        swap2(&local_50);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                      ,0x81,
                      "int read_attribute_sub(coda_cdf_product *, int64_t, int32_t, coda_type *, coda_dynamic_type **)"
                     );
      case 4:
        swap4(&local_50);
        break;
      case 8:
        swap8(&local_50);
      }
    }
    switch(*(undefined4 *)((long)attribute_local + 0xc)) {
    case 0:
      pcVar2 = coda_mem_int8_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                 (coda_product *)offset_local,local_50);
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 1:
      pcVar2 = coda_mem_uint8_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                  (coda_product *)offset_local,local_50);
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 2:
      pcVar2 = coda_mem_int16_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                  (coda_product *)offset_local,CONCAT11(uStack_4f,local_50));
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 3:
      pcVar2 = coda_mem_uint16_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                   (coda_product *)offset_local,CONCAT11(uStack_4f,local_50));
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 4:
      pcVar2 = coda_mem_int32_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                  (coda_product *)offset_local,
                                  CONCAT22(uStack_4e,CONCAT11(uStack_4f,local_50)));
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 5:
      pcVar2 = coda_mem_uint32_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                   (coda_product *)offset_local,
                                   CONCAT22(uStack_4e,CONCAT11(uStack_4f,local_50)));
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 6:
      pcVar2 = coda_mem_int64_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                  (coda_product *)offset_local,
                                  CONCAT44(uStack_4c,
                                           CONCAT22(uStack_4e,CONCAT11(uStack_4f,local_50))));
      *(coda_mem_data **)buffer = pcVar2;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf.c"
                    ,0xaf,
                    "int read_attribute_sub(coda_cdf_product *, int64_t, int32_t, coda_type *, coda_dynamic_type **)"
                   );
    case 8:
      pcVar2 = coda_mem_float_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                  (coda_product *)offset_local,
                                  (float)CONCAT22(uStack_4e,CONCAT11(uStack_4f,local_50)));
      *(coda_mem_data **)buffer = pcVar2;
      break;
    case 9:
      pcVar2 = coda_mem_double_new((coda_type_number *)attribute_local,(coda_dynamic_type *)0x0,
                                   (coda_product *)offset_local,
                                   (double)CONCAT44(uStack_4c,
                                                    CONCAT22(uStack_4e,CONCAT11(uStack_4f,local_50))
                                                   ));
      *(coda_mem_data **)buffer = pcVar2;
    }
  }
  if (*(long *)buffer == 0) {
    product_file_local._4_4_ = -1;
  }
  else {
    product_file_local._4_4_ = 0;
  }
  return product_file_local._4_4_;
}

Assistant:

static int read_attribute_sub(coda_cdf_product *product_file, int64_t offset, int32_t byte_size, coda_type *definition,
                              coda_dynamic_type **attribute)
{
    if (definition->type_class == coda_text_class)
    {
        char *buffer;

        buffer = malloc(byte_size + 1);
        if (buffer == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)byte_size + 1, __FILE__, __LINE__);
            return -1;
        }
        if (read_bytes(product_file->raw_product, offset, byte_size, buffer) != 0)
        {
            free(buffer);
            return -1;
        }
        buffer[byte_size] = '\0';
        *attribute = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)definition, NULL,
                                                              (coda_product *)product_file, buffer);
        free(buffer);
    }
    else
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness other_endianness = coda_little_endian;
#else
        coda_endianness other_endianness = coda_big_endian;
#endif
        union
        {
            int8_t as_int8[8];
            uint8_t as_uint8[8];
            int16_t as_int16[4];
            uint16_t as_uint16[4];
            int32_t as_int32[2];
            uint32_t as_uint32[2];
            int64_t as_int64[1];
            float as_float[2];
            double as_double[1];
        } buffer;

        if (read_bytes(product_file->raw_product, offset, byte_size, buffer.as_int8) != 0)
        {
            return -1;
        }
        if (product_file->endianness == other_endianness)
        {
            switch (byte_size)
            {
                case 1:
                    break;
                case 2:
                    swap2(buffer.as_int16);
                    break;
                case 4:
                    swap4(buffer.as_int32);
                    break;
                case 8:
                    swap8(buffer.as_int64);
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
        switch (definition->read_type)
        {
            case coda_native_type_int8:
                *attribute = (coda_dynamic_type *)coda_mem_int8_new((coda_type_number *)definition, NULL,
                                                                    (coda_product *)product_file, buffer.as_int8[0]);
                break;
            case coda_native_type_uint8:
                *attribute = (coda_dynamic_type *)coda_mem_uint8_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_uint8[0]);
                break;
            case coda_native_type_int16:
                *attribute = (coda_dynamic_type *)coda_mem_int16_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int16[0]);
                break;
            case coda_native_type_uint16:
                *attribute = (coda_dynamic_type *)coda_mem_uint16_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_uint16[0]);
                break;
            case coda_native_type_int32:
                *attribute = (coda_dynamic_type *)coda_mem_int32_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int32[0]);
                break;
            case coda_native_type_uint32:
                *attribute = (coda_dynamic_type *)coda_mem_uint32_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_uint32[0]);
                break;
            case coda_native_type_int64:
                *attribute = (coda_dynamic_type *)coda_mem_int64_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_int64[0]);
                break;
            case coda_native_type_float:
                *attribute = (coda_dynamic_type *)coda_mem_float_new((coda_type_number *)definition, NULL,
                                                                     (coda_product *)product_file, buffer.as_float[0]);
                break;
            case coda_native_type_double:
                *attribute = (coda_dynamic_type *)coda_mem_double_new((coda_type_number *)definition, NULL,
                                                                      (coda_product *)product_file,
                                                                      buffer.as_double[0]);
                break;
            default:
                assert(0);
                exit(1);
        }
    }
    if (*attribute == NULL)
    {
        return -1;
    }
    return 0;
}